

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crange.cpp
# Opt level: O0

vector<CRange::Tdata,_std::allocator<CRange::Tdata>_> *
CRange::init_target(vector<CRange::Tdata,_std::allocator<CRange::Tdata>_> *__return_storage_ptr__,
                   string *targetfile)

{
  int iVar1;
  long lVar2;
  char *pcVar3;
  dictionary *d_00;
  ostream *poVar4;
  vector<CRange::Tdata,_std::allocator<CRange::Tdata>_> *__x;
  undefined1 local_d0 [8];
  Tdata t;
  char *sec;
  int i;
  int nsec;
  dictionary *d;
  string *targetfile_local;
  vector<CRange::Tdata,_std::allocator<CRange::Tdata>_> *target_list;
  
  std::vector<CRange::Tdata,_std::allocator<CRange::Tdata>_>::vector(__return_storage_ptr__);
  lVar2 = std::__cxx11::string::length();
  if (lVar2 != 0) {
    pcVar3 = (char *)std::__cxx11::string::c_str();
    iVar1 = access(pcVar3,4);
    if (iVar1 == 0) {
      pcVar3 = (char *)std::__cxx11::string::c_str();
      d_00 = iniparser_load(pcVar3);
      iVar1 = iniparser_getnsec(d_00);
      for (sec._4_4_ = 0; sec._4_4_ < iVar1; sec._4_4_ = sec._4_4_ + 1) {
        t._hash = (double)iniparser_getsecname(d_00,sec._4_4_);
        Tdata::Tdata((Tdata *)local_d0,(char *)t._hash,d_00);
        std::vector<CRange::Tdata,_std::allocator<CRange::Tdata>_>::push_back
                  (__return_storage_ptr__,(value_type *)local_d0);
        Tdata::~Tdata((Tdata *)local_d0);
      }
      iniparser_freedict(d_00);
    }
    else {
      poVar4 = std::operator<<((ostream *)&std::cerr,"Could not read target file: ");
      poVar4 = std::operator<<(poVar4,(string *)targetfile);
      poVar4 = std::operator<<(poVar4,". Using default target data.");
      std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
    }
  }
  __x = default_target(__return_storage_ptr__);
  std::vector<CRange::Tdata,_std::allocator<CRange::Tdata>_>::operator=(__return_storage_ptr__,__x);
  return __return_storage_ptr__;
}

Assistant:

std::vector<CRange::Tdata> CRange::init_target( const std::string &targetfile )
{
    std::vector<CRange::Tdata> target_list;
    if (targetfile.length() > 0) {
        if (access(targetfile.c_str(), R_OK) == 0) {
            dictionary *d = iniparser_load(targetfile.c_str());
            int nsec = iniparser_getnsec(d);
            for (int i = 0; i < nsec; i++) {
                const char *sec = iniparser_getsecname(d, i);
                CRange::Tdata t(sec, d);
                target_list.push_back(t);
            }
            iniparser_freedict(d);
        } else {
            std::cerr << "Could not read target file: " << targetfile
                      << ". Using default target data." << std::endl;
        }
    }
    target_list = CRange::default_target(target_list);
    return target_list;
}